

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O3

void __thiscall QMarkdownTextEdit::updateLineNumberArea(QMarkdownTextEdit *this,QRect rect,int dy)

{
  LineNumArea *this_00;
  char cVar1;
  int iVar2;
  long lVar3;
  QRect local_40;
  long local_30;
  undefined8 local_28;
  
  local_40._8_8_ = rect._8_8_;
  local_40._0_8_ = rect._0_8_;
  if (dy == 0) {
    this_00 = this->_lineNumArea;
    iVar2 = LineNumArea::lineNumAreaWidth(this_00);
    local_30 = (ulong)(uint)rect.y1 << 0x20;
    local_28 = CONCAT44(rect.y2,iVar2 + -1);
    QWidget::update((QRect *)this_00);
  }
  else {
    QWidget::scroll((int)this->_lineNumArea,0);
  }
  updateLineNumAreaGeometry(this);
  lVar3 = QAbstractScrollArea::viewport();
  lVar3 = *(long *)(lVar3 + 0x20);
  local_28 = CONCAT44(*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18),
                      *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14));
  iVar2 = (int)&local_30;
  local_30 = 0;
  cVar1 = QRect::contains(&local_40,SUB81(&local_30,0));
  if (cVar1 != '\0') {
    updateLineNumberAreaWidth(this,iVar2);
  }
  return;
}

Assistant:

void QMarkdownTextEdit::updateLineNumberArea(const QRect rect, int dy)
{
    if (dy)
        _lineNumArea->scroll(0, dy);
    else
        _lineNumArea->update(0, rect.y(), _lineNumArea->sizeHint().width(), rect.height());

    updateLineNumAreaGeometry();

    if (rect.contains(viewport()->rect())) {
        updateLineNumberAreaWidth(0);
    }
}